

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleRemoveAtCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  string *var;
  long lVar7;
  pointer pcVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> removed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string local_1c8;
  string value;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string
              ((string *)&value,"sub-command REMOVE_AT requires at least two arguments.",
               (allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,&value);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  var = pbVar1 + 1;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = GetList(this,&varArgsExpanded,var);
  if (bVar2) {
    if (varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar8 = (pointer)((long)varArgsExpanded.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)varArgsExpanded.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar6 = 2;
      lVar7 = 0x40;
      while( true ) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
                uVar6;
        if (bVar2) break;
        iVar3 = atoi(*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
        uVar5 = (iVar3 >> 0x1f & (uint)pcVar8) + iVar3;
        if (((int)uVar5 < 0) || (pcVar8 <= (pointer)(ulong)uVar5)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&value);
          poVar4 = std::operator<<((ostream *)&value,"index: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
          poVar4 = std::operator<<(poVar4," out of range (-");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4,")");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&value);
          goto LAB_003240fa;
        }
        value._M_dataplus._M_p = (pointer)(ulong)uVar5;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&removed,(unsigned_long *)&value);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x20;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      value._M_string_length =
           (size_type)
           std::
           __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
      value._M_dataplus._M_p =
           (pointer)removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_1c8._M_string_length =
           (size_type)
           cmRemoveIndices<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                     (&varArgsExpanded,
                      (Range<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&value);
      local_1c8._M_dataplus._M_p =
           (pointer)varArgsExpanded.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&value,(Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_1c8,";");
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,var,value._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&value);
LAB_003240fa:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&removed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      goto LAB_00324102;
    }
    std::__cxx11::string::string
              ((string *)&value,"REMOVE_AT given empty list",(allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,&value);
  }
  else {
    std::__cxx11::string::string
              ((string *)&value,"sub-command REMOVE_AT requires list to be present.",
               (allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,&value);
  }
  std::__cxx11::string::~string((string *)&value);
  bVar2 = false;
LAB_00324102:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&varArgsExpanded);
  return bVar2;
}

Assistant:

bool cmListCommand::HandleRemoveAtCommand(
  std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("sub-command REMOVE_AT requires at least "
                   "two arguments.");
    return false;
    }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if ( !this->GetList(varArgsExpanded, listName) )
    {
    this->SetError("sub-command REMOVE_AT requires list to be present.");
    return false;
    }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if(varArgsExpanded.empty())
    {
    this->SetError("REMOVE_AT given empty list");
    return false;
    }

  size_t cc;
  std::vector<size_t> removed;
  size_t nitem = varArgsExpanded.size();
  for ( cc = 2; cc < args.size(); ++ cc )
    {
    int item = atoi(args[cc].c_str());
    if ( item < 0 )
      {
      item = (int)nitem + item;
      }
    if ( item < 0 || nitem <= (size_t)item )
      {
      std::ostringstream str;
      str << "index: " << item << " out of range (-"
          << nitem << ", "
          << nitem - 1 << ")";
      this->SetError(str.str());
      return false;
      }
    removed.push_back(static_cast<size_t>(item));
    }

  std::sort(removed.begin(), removed.end());
  std::vector<size_t>::const_iterator remEnd =
      std::unique(removed.begin(), removed.end());
  std::vector<size_t>::const_iterator remBegin = removed.begin();

  std::vector<std::string>::const_iterator argsEnd =
      cmRemoveIndices(varArgsExpanded, cmRange(remBegin, remEnd));
  std::vector<std::string>::const_iterator argsBegin = varArgsExpanded.begin();
  std::string value = cmJoin(cmRange(argsBegin, argsEnd), ";");

  this->Makefile->AddDefinition(listName, value.c_str());
  return true;
}